

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::LegacyVectorLimitCase::iterate
          (LegacyVectorLimitCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  Enum<int,_2UL> *value_00;
  Enum<int,_2UL> *value_01;
  allocator<char> local_171;
  ScopedLogSection section;
  string local_168;
  StateQueryMemoryWriteGuard<int> value;
  CallLogWrapper gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  code *local_80;
  GLenum local_78;
  ResultCollector result;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168," // ERROR: ",(allocator<char> *)&local_120);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"TiedTo",&local_171);
  value.m_postguard = this->m_legacyTarget;
  value._0_8_ = glu::getGettableStateName;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_100,(de *)&value,value_00);
  std::operator+(&local_e0,&local_100," is ");
  local_78 = this->m_componentTarget;
  local_80 = glu::getGettableStateName;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_a0,(de *)&local_80,value_01);
  std::operator+(&local_c0,&local_e0,&local_a0);
  std::operator+(&local_120,&local_c0," divided by four");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_168,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_168);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&value);
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_componentTarget,&value.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Got Error ",(allocator<char> *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)glu::getErrorName;
    local_a0._M_string_length._0_4_ = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_100,&local_a0);
    std::operator+(&local_c0,&local_e0,&local_100);
    std::operator+(&local_120,&local_c0,": ");
    std::operator+(&local_168,&local_120,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&value,&result)
  ;
  if (bVar2) {
    deqp::gls::StateQueryUtil::verifyStateInteger
              (&result,&gl,this->m_legacyTarget,value.m_value / 4,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

LegacyVectorLimitCase::IterateResult LegacyVectorLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "TiedTo", de::toString(glu::getGettableStateStr(m_legacyTarget)) +
																			" is " +
																			de::toString(glu::getGettableStateStr(m_componentTarget)) +
																			" divided by four");

		StateQueryMemoryWriteGuard<glw::GLint> value;
		gl.glGetIntegerv(m_componentTarget, &value);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (value.verifyValidity(result))
			verifyStateInteger(result, gl, m_legacyTarget, ((int)value) / 4, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}